

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O2

void jinit_c_coef_controller(j_compress_ptr cinfo,boolean need_full_buffer)

{
  _func_jvirt_barray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var1;
  jpeg_c_coef_controller *pjVar2;
  long lVar3;
  long lVar4;
  jvirt_barray_ptr pjVar5;
  _func_void_j_compress_ptr_J_BUF_MODE *p_Var6;
  int *piVar7;
  long lVar8;
  
  pjVar2 = (jpeg_c_coef_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0xc0);
  cinfo->coef = pjVar2;
  pjVar2->start_pass = start_pass_coef;
  if (need_full_buffer == 0) {
    p_Var6 = (_func_void_j_compress_ptr_J_BUF_MODE *)
             (*cinfo->mem->alloc_large)((j_common_ptr)cinfo,1,0x500);
    for (lVar8 = 4; lVar8 != 0xe; lVar8 = lVar8 + 1) {
      (&pjVar2->start_pass)[lVar8] = p_Var6;
      p_Var6 = p_Var6 + 0x80;
    }
    pjVar2[7].start_pass = (_func_void_j_compress_ptr_J_BUF_MODE *)0x0;
  }
  else {
    piVar7 = &cinfo->comp_info->h_samp_factor;
    for (lVar8 = 0; lVar8 < cinfo->num_components; lVar8 = lVar8 + 1) {
      p_Var1 = cinfo->mem->request_virt_barray;
      lVar3 = jround_up((ulong)(uint)piVar7[5],(long)*piVar7);
      lVar4 = jround_up((ulong)(uint)piVar7[6],(long)piVar7[1]);
      pjVar5 = (*p_Var1)((j_common_ptr)cinfo,1,0,(JDIMENSION)lVar3,(JDIMENSION)lVar4,piVar7[1]);
      (&pjVar2[7].start_pass)[lVar8] = (_func_void_j_compress_ptr_J_BUF_MODE *)pjVar5;
      piVar7 = piVar7 + 0x18;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_c_coef_controller (j_compress_ptr cinfo, boolean need_full_buffer)
{
  my_coef_ptr coef;

  coef = (my_coef_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_coef_controller));
  cinfo->coef = (struct jpeg_c_coef_controller *) coef;
  coef->pub.start_pass = start_pass_coef;

  /* Create the coefficient buffer. */
  if (need_full_buffer) {
#ifdef FULL_COEF_BUFFER_SUPPORTED
    /* Allocate a full-image virtual array for each component, */
    /* padded to a multiple of samp_factor DCT blocks in each direction. */
    int ci;
    jpeg_component_info *compptr;

    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
	 ci++, compptr++) {
      coef->whole_image[ci] = (*cinfo->mem->request_virt_barray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, FALSE,
	 (JDIMENSION) jround_up((long) compptr->width_in_blocks,
				(long) compptr->h_samp_factor),
	 (JDIMENSION) jround_up((long) compptr->height_in_blocks,
				(long) compptr->v_samp_factor),
	 (JDIMENSION) compptr->v_samp_factor);
    }
#else
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif
  } else {
    /* We only need a single-MCU buffer. */
    JBLOCKROW buffer;
    int i;

    buffer = (JBLOCKROW)
      (*cinfo->mem->alloc_large) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				  C_MAX_BLOCKS_IN_MCU * SIZEOF(JBLOCK));
    for (i = 0; i < C_MAX_BLOCKS_IN_MCU; i++) {
      coef->MCU_buffer[i] = buffer + i;
    }
    coef->whole_image[0] = NULL; /* flag for no virtual arrays */
  }
}